

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O0

int zmq_send(void *s_,void *buf_,size_t len_,int flags_)

{
  int iVar1;
  int iVar2;
  socket_base_t *psVar3;
  int *piVar4;
  char *pcVar5;
  char *errstr;
  int rc2;
  int err;
  int rc;
  zmq_msg_t msg;
  socket_base_t *s;
  void *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  zmq_msg_t *in_stack_ffffffffffffff90;
  socket_base_t *in_stack_ffffffffffffff98;
  int local_4;
  
  psVar3 = as_socket_base_t(in_stack_ffffffffffffff68);
  if (psVar3 == (socket_base_t *)0x0) {
    local_4 = -1;
  }
  else {
    iVar1 = zmq_msg_init_buffer((zmq_msg_t *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff68,0x1cb2e1);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = s_sendmsg(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,iVar1);
      if (local_4 < 0) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        iVar2 = zmq_msg_close((zmq_msg_t *)0x1cb333);
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmq.cpp"
                  ,0x19d);
          fflush(_stderr);
          zmq::zmq_abort((char *)0x1cb39b);
        }
        piVar4 = __errno_location();
        *piVar4 = iVar1;
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int zmq_send (void *s_, const void *buf_, size_t len_, int flags_)
{
    zmq::socket_base_t *s = as_socket_base_t (s_);
    if (!s)
        return -1;
    zmq_msg_t msg;
    int rc = zmq_msg_init_buffer (&msg, buf_, len_);
    if (unlikely (rc < 0))
        return -1;

    rc = s_sendmsg (s, &msg, flags_);
    if (unlikely (rc < 0)) {
        const int err = errno;
        const int rc2 = zmq_msg_close (&msg);
        errno_assert (rc2 == 0);
        errno = err;
        return -1;
    }
    //  Note the optimisation here. We don't close the msg object as it is
    //  empty anyway. This may change when implementation of zmq_msg_t changes.
    return rc;
}